

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlDocPtr xmlCtxtReadIO(xmlParserCtxtPtr ctxt,xmlInputReadCallback ioread,
                       xmlInputCloseCallback ioclose,void *ioctx,char *URL,char *encoding,
                       int options)

{
  xmlParserInputBufferPtr input;
  xmlParserInputPtr value;
  xmlDocPtr pxVar1;
  
  if (ctxt != (xmlParserCtxtPtr)0x0 && ioread != (xmlInputReadCallback)0x0) {
    xmlInitParser();
    xmlCtxtReset(ctxt);
    input = xmlParserInputBufferCreateIO(ioread,ioclose,ioctx,XML_CHAR_ENCODING_NONE);
    if (input == (xmlParserInputBufferPtr)0x0) {
      if (ioclose != (xmlInputCloseCallback)0x0) {
        (*ioclose)(ioctx);
      }
    }
    else {
      value = xmlNewIOInputStream(ctxt,input,XML_CHAR_ENCODING_NONE);
      if (value != (xmlParserInputPtr)0x0) {
        inputPush(ctxt,value);
        pxVar1 = xmlDoRead(ctxt,URL,encoding,options,1);
        return pxVar1;
      }
      xmlFreeParserInputBuffer(input);
    }
  }
  return (xmlDocPtr)0x0;
}

Assistant:

xmlDocPtr
xmlCtxtReadIO(xmlParserCtxtPtr ctxt, xmlInputReadCallback ioread,
              xmlInputCloseCallback ioclose, void *ioctx,
	      const char *URL,
              const char *encoding, int options)
{
    xmlParserInputBufferPtr input;
    xmlParserInputPtr stream;

    if (ioread == NULL)
        return (NULL);
    if (ctxt == NULL)
        return (NULL);
    xmlInitParser();

    xmlCtxtReset(ctxt);

    input = xmlParserInputBufferCreateIO(ioread, ioclose, ioctx,
                                         XML_CHAR_ENCODING_NONE);
    if (input == NULL) {
        if (ioclose != NULL)
            ioclose(ioctx);
        return (NULL);
    }
    stream = xmlNewIOInputStream(ctxt, input, XML_CHAR_ENCODING_NONE);
    if (stream == NULL) {
        xmlFreeParserInputBuffer(input);
        return (NULL);
    }
    inputPush(ctxt, stream);
    return (xmlDoRead(ctxt, URL, encoding, options, 1));
}